

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void __thiscall TestValueTestCommentBefore::runTestCase(TestValueTestCommentBefore *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestResult *pTVar4;
  Value *this_00;
  size_t sVar5;
  Value *in_RCX;
  char *pcVar6;
  string exp2;
  string res2;
  string exp2_1;
  char expected_2 [8];
  char expected [42];
  Value val;
  Value other;
  StreamWriterBuilder wbuilder;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  undefined2 uStack_118;
  undefined3 uStack_116;
  undefined5 uStack_113;
  undefined3 uStack_10e;
  Value local_100;
  ValueHolder local_d8;
  long local_d0;
  char local_c8 [24];
  StreamWriterBuilder local_b0;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(&local_100,nullValue);
  Json::Value::setComment(&local_100,"// this comment should appear before",commentBefore);
  Json::StreamWriterBuilder::StreamWriterBuilder(&local_b0);
  Json::Value::Value(&local_58,"All");
  this_00 = Json::Value::operator[](&local_b0.settings_,"commentStyle");
  Json::Value::operator=(this_00,&local_58);
  Json::Value::~Value(&local_58);
  uStack_118 = 0x6f66;
  uStack_116 = 0xa6572;
  uStack_113 = 0x6c6c756e;
  local_138.field_2._M_local_buf[0] = 's';
  local_138.field_2._M_local_buf[1] = 'h';
  local_138.field_2._M_local_buf[2] = 'o';
  local_138.field_2._M_local_buf[3] = 'u';
  local_138.field_2._M_local_buf[4] = 'l';
  local_138.field_2._M_local_buf[5] = 'd';
  local_138.field_2._M_local_buf[6] = ' ';
  local_138.field_2._M_local_buf[7] = 'a';
  local_138.field_2._8_2_ = 0x7070;
  local_138.field_2._10_3_ = 0x726165;
  local_138.field_2._13_3_ = 0x656220;
  local_138._M_dataplus._M_p = (pointer)0x2073696874202f2f;
  local_138._M_string_length._0_1_ = 'c';
  local_138._M_string_length._1_1_ = 'o';
  local_138._M_string_length._2_1_ = 'm';
  local_138._M_string_length._3_1_ = 'm';
  local_138._M_string_length._4_1_ = 'e';
  local_138._M_string_length._5_1_ = 'n';
  local_138._M_string_length._6_1_ = 't';
  local_138._M_string_length._7_1_ = ' ';
  Json::writeString_abi_cxx11_((string *)&local_d8,(Json *)&local_b0,(Factory *)&local_100,in_RCX);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  paVar1 = &local_1b8.field_2;
  local_1b8._M_dataplus._M_p = (pointer)paVar1;
  sVar5 = strlen((char *)&local_138);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,&local_138,(long)&local_138._M_dataplus._M_p + sVar5);
  paVar2 = &local_1d8.field_2;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_d8.int_,local_d8.string_ + local_d0);
  JsonTest::checkStringEqual
            (pTVar4,&local_1b8,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x60f,"expected == result");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  Json::Value::toStyledString_abi_cxx11_(&local_1b8,&local_100);
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\n","");
  std::__cxx11::string::append((char *)&local_1d8);
  std::__cxx11::string::append((char *)&local_1d8);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_1d8._M_dataplus._M_p,
             local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
  paVar3 = &local_178.field_2;
  local_178._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_1b8._M_dataplus._M_p,
             local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar4,&local_198,&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x614,"exp2 == res2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar3) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8.string_);
  }
  Json::Value::Value((Value *)&local_d8,"hello");
  Json::Value::swapPayload(&local_100,(Value *)&local_d8);
  uStack_118 = 0x6f66;
  uStack_116 = 0xa6572;
  uStack_113 = 0x6c6c656822;
  uStack_10e = 0x226f;
  local_138.field_2._M_local_buf[0] = 's';
  local_138.field_2._M_local_buf[1] = 'h';
  local_138.field_2._M_local_buf[2] = 'o';
  local_138.field_2._M_local_buf[3] = 'u';
  local_138.field_2._M_local_buf[4] = 'l';
  local_138.field_2._M_local_buf[5] = 'd';
  local_138.field_2._M_local_buf[6] = ' ';
  local_138.field_2._M_local_buf[7] = 'a';
  local_138.field_2._8_2_ = 0x7070;
  local_138.field_2._10_3_ = 0x726165;
  local_138.field_2._13_3_ = 0x656220;
  local_138._M_dataplus._M_p = (pointer)0x2073696874202f2f;
  local_138._M_string_length._0_1_ = 'c';
  local_138._M_string_length._1_1_ = 'o';
  local_138._M_string_length._2_1_ = 'm';
  local_138._M_string_length._3_1_ = 'm';
  local_138._M_string_length._4_1_ = 'e';
  local_138._M_string_length._5_1_ = 'n';
  local_138._M_string_length._6_1_ = 't';
  local_138._M_string_length._7_1_ = ' ';
  Json::writeString_abi_cxx11_(&local_1b8,(Json *)&local_b0,(Factory *)&local_100,(Value *)pcVar6);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  sVar5 = strlen((char *)&local_138);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,&local_138,(long)&local_138._M_dataplus._M_p + sVar5);
  paVar1 = &local_198.field_2;
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_1b8._M_dataplus._M_p,
             local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_1d8,&local_198,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x61b,"expected == result");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  Json::Value::toStyledString_abi_cxx11_(&local_1d8,&local_100);
  local_198._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"\n","");
  std::__cxx11::string::append((char *)&local_198);
  std::__cxx11::string::append((char *)&local_198);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_178._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_198._M_dataplus._M_p,
             local_198._M_dataplus._M_p + local_198._M_string_length);
  paVar1 = &local_158.field_2;
  local_158._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,local_1d8._M_dataplus._M_p,
             local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_178,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x620,"exp2 == res2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar3) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_178._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"null\n","");
  Json::Value::toStyledString_abi_cxx11_(&local_158,(Value *)&local_d8);
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  JsonTest::checkStringEqual
            (pTVar4,&local_178,&local_158,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x621,"\"null\\n\" == other.toStyledString()");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != paVar1) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar3) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  Json::Value::Value(&local_80,"hello");
  Json::Value::operator=(&local_100,&local_80);
  Json::Value::~Value(&local_80);
  local_158._M_dataplus._M_p = (pointer)0x226f6c6c656822;
  Json::writeString_abi_cxx11_(&local_138,(Json *)&local_b0,(Factory *)&local_100,(Value *)pcVar6);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  sVar5 = strlen((char *)&local_158);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,&local_158,(long)&local_158._M_dataplus._M_p + sVar5);
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,local_138._M_dataplus._M_p,
             local_138._M_dataplus._M_p + local_138._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_1b8,&local_1d8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x629,"expected == result");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  Json::Value::toStyledString_abi_cxx11_(&local_1b8,&local_100);
  local_1d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  std::__cxx11::string::append((char *)&local_1d8);
  std::__cxx11::string::append((char *)&local_1d8);
  pTVar4 = (this->super_ValueTest).super_TestCase.result_;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,local_1d8._M_dataplus._M_p,
             local_1d8._M_dataplus._M_p + local_1d8._M_string_length);
  local_178._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_1b8._M_dataplus._M_p,
             local_1b8._M_dataplus._M_p + local_1b8._M_string_length);
  JsonTest::checkStringEqual
            (pTVar4,&local_198,&local_178,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0x62e,"exp2 == res2");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != paVar3) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  Json::Value::~Value((Value *)&local_d8);
  Json::StreamWriterBuilder::~StreamWriterBuilder(&local_b0);
  Json::Value::~Value(&local_100);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, CommentBefore) {
  Json::Value val; // fill val
  val.setComment("// this comment should appear before", Json::commentBefore);
  Json::StreamWriterBuilder wbuilder;
  wbuilder.settings_["commentStyle"] = "All";
  {
    char const expected[] = "// this comment should appear before\nnull";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
  Json::Value other = "hello";
  val.swapPayload(other);
  {
    char const expected[] = "// this comment should appear before\n\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "\n";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
    JSONTEST_ASSERT_STRING_EQUAL("null\n", other.toStyledString());
  }
  val = "hello";
  // val.setComment("// this comment should appear before", Json::CommentPlacement::commentBefore);
  // Assignment over-writes comments.
  {
    char const expected[] = "\"hello\"";
    std::string result = Json::writeString(wbuilder, val);
    JSONTEST_ASSERT_STRING_EQUAL(expected, result);
    std::string res2 = val.toStyledString();
    std::string exp2 = "";
    exp2 += expected;
    exp2 += "\n";
    JSONTEST_ASSERT_STRING_EQUAL(exp2, res2);
  }
}